

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

btDbvtVolume * VolumeOf(btDbvtVolume *__return_storage_ptr__,Face *f,btScalar margin)

{
  btVector3 local_38;
  btVector3 *local_28;
  btVector3 *pbStack_20;
  btVector3 *local_18;
  
  local_28 = &f->m_n[0]->m_x;
  pbStack_20 = &f->m_n[1]->m_x;
  local_18 = &f->m_n[2]->m_x;
  btDbvtAabbMm::FromPoints(__return_storage_ptr__,&local_28,3);
  local_38.m_floats[3] = 0.0;
  local_38.m_floats[0] = margin;
  local_38.m_floats[1] = margin;
  local_38.m_floats[2] = margin;
  btDbvtAabbMm::Expand(__return_storage_ptr__,&local_38);
  return __return_storage_ptr__;
}

Assistant:

static inline btDbvtVolume	VolumeOf(	const btSoftBody::Face& f,
									 btScalar margin)
{
	const btVector3*	pts[]={	&f.m_n[0]->m_x,
		&f.m_n[1]->m_x,
		&f.m_n[2]->m_x};
	btDbvtVolume		vol=btDbvtVolume::FromPoints(pts,3);
	vol.Expand(btVector3(margin,margin,margin));
	return(vol);
}